

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2-arch.c
# Opt level: O0

void fill_segment_default(argon2_instance_t *instance,argon2_position_t position)

{
  argon2_instance_t *instance_local;
  argon2_position_t position_local;
  
  fill_segment_64(instance,position);
  return;
}

Assistant:

void fill_segment_default(const argon2_instance_t *instance,
                          argon2_position_t position)
{
    fill_segment_64(instance, position);
}